

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QMakeLocalFileName>::emplace<QMakeLocalFileName>
          (QGenericArrayOps<QMakeLocalFileName> *this,qsizetype i,QMakeLocalFileName *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  long in_RSI;
  QMakeLocalFileName *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QMakeLocalFileName tmp;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5e;
  byte bVar6;
  QMakeLocalFileName *this_00;
  Inserter local_88;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QMakeLocalFileName>::needsDetach
                    ((QArrayDataPointer<QMakeLocalFileName> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (in_RDI->real_name).d.size) &&
       (qVar3 = QArrayDataPointer<QMakeLocalFileName>::freeSpaceAtEnd
                          ((QArrayDataPointer<QMakeLocalFileName> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff5e,
                                                   CONCAT24(in_stack_ffffffffffffff5c,
                                                            in_stack_ffffffffffffff58)))),
       qVar3 != 0)) {
      QArrayDataPointer<QMakeLocalFileName>::end((QArrayDataPointer<QMakeLocalFileName> *)in_RDI);
      QMakeLocalFileName::QMakeLocalFileName
                (in_RDI,(QMakeLocalFileName *)
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      (in_RDI->real_name).d.size = (in_RDI->real_name).d.size + 1;
      goto LAB_001b68fb;
    }
    if ((in_RSI == 0) &&
       (qVar3 = QArrayDataPointer<QMakeLocalFileName>::freeSpaceAtBegin
                          ((QArrayDataPointer<QMakeLocalFileName> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff5e,
                                                   CONCAT24(in_stack_ffffffffffffff5c,
                                                            in_stack_ffffffffffffff58)))),
       qVar3 != 0)) {
      QArrayDataPointer<QMakeLocalFileName>::begin
                ((QArrayDataPointer<QMakeLocalFileName> *)0x1b675a);
      QMakeLocalFileName::QMakeLocalFileName
                (in_RDI,(QMakeLocalFileName *)
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      (in_RDI->real_name).d.ptr = (in_RDI->real_name).d.ptr + -0x18;
      (in_RDI->real_name).d.size = (in_RDI->real_name).d.size + 1;
      goto LAB_001b68fb;
    }
  }
  memset(&local_38,0,0x30);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QMakeLocalFileName::QMakeLocalFileName
            (in_RDI,(QMakeLocalFileName *)
                    CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  bVar4 = (in_RDI->real_name).d.size != 0;
  uVar5 = bVar4 && in_RSI == 0;
  uVar2 = (uint)(bVar4 && in_RSI == 0);
  bVar6 = uVar5;
  QArrayDataPointer<QMakeLocalFileName>::detachAndGrow
            ((QArrayDataPointer<QMakeLocalFileName> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QMakeLocalFileName **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff5c,uVar2))),
             (QArrayDataPointer<QMakeLocalFileName> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_88,(QArrayDataPointer<QMakeLocalFileName> *)in_RDI);
    Inserter::insertOne(in_RDX,CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff5c,
                                                                      uVar2))),in_RDI);
    Inserter::~Inserter(&local_88);
  }
  else {
    QArrayDataPointer<QMakeLocalFileName>::begin((QArrayDataPointer<QMakeLocalFileName> *)0x1b688b);
    QMakeLocalFileName::QMakeLocalFileName
              (in_RDI,(QMakeLocalFileName *)CONCAT17(uVar5,in_stack_ffffffffffffff48));
    (in_RDI->real_name).d.ptr = (in_RDI->real_name).d.ptr + -0x18;
    (in_RDI->real_name).d.size = (in_RDI->real_name).d.size + 1;
  }
  QMakeLocalFileName::~QMakeLocalFileName(in_RDI);
LAB_001b68fb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }